

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

void __thiscall soplex::SSVectorBase<double>::reDim(SSVectorBase<double> *this,int newdim)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = (this->super_IdxSet).idx;
  for (uVar3 = (ulong)(uint)(this->super_IdxSet).num; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    if (newdim <= piVar2[uVar3 - 1]) {
      iVar1 = (this->super_IdxSet).num;
      (this->super_IdxSet).num = iVar1 + -1;
      piVar2[uVar3 - 1] = piVar2[(long)iVar1 + -1];
    }
  }
  VectorBase<double>::reDim(&this->super_VectorBase<double>,newdim,true);
  setMax(this,(int)((ulong)((long)(this->super_VectorBase<double>).val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                           (long)(this->super_VectorBase<double>).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3) + 1);
  return;
}

Assistant:

void reDim(int newdim)
   {
      for(int i = IdxSet::size() - 1; i >= 0; --i)
      {
         if(index(i) >= newdim)
            remove(i);
      }

      VectorBase<R>::reDim(newdim);
      setMax(VectorBase<R>::memSize() + 1);

      assert(isConsistent());
   }